

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O2

bool __thiscall
FpgaIO::ReadRTL8211F_Register(FpgaIO *this,uint chan,uint phyAddr,uint regAddr,uint16_t *data)

{
  BasePort *pBVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  uint uVar5;
  ulong uVar6;
  uint16_t *puVar7;
  bool bVar8;
  quadlet_t read_data;
  uint local_40;
  uint local_3c;
  uint16_t *local_38;
  
  bVar2 = WaitRTL8211F_Idle(this,"ReadRTL8211F_Register",chan,0x14);
  if (bVar2) {
    uVar6 = (ulong)(chan << 8 | 0x40a0);
    pBVar1 = (this->super_BoardIO).port;
    iVar3 = (*pBVar1->_vptr_BasePort[0x24])
                      (pBVar1,(ulong)(this->super_BoardIO).BoardId,uVar6,
                       (ulong)((phyAddr & 0x1f) * 0x800000 + (regAddr & 0x1f) * 0x40000 + 0x60000000
                              ));
    uVar5 = 0;
    if ((char)iVar3 != '\0') {
      local_40 = regAddr;
      local_38 = data;
      Amp1394_Sleep(0.001);
      bVar2 = false;
      bVar8 = false;
      do {
        puVar7 = local_38;
        if (bVar2) {
          if ((bVar8) || (0x13 < uVar5)) goto LAB_00107cc7;
        }
        else if (0x13 < uVar5) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "ReadRTL8211F_Register timeout waiting for data, read ");
          *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
               *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
          puVar7 = local_38;
          goto LAB_00107d4f;
        }
        uVar5 = uVar5 + 1;
        pBVar1 = (this->super_BoardIO).port;
        iVar3 = (*pBVar1->_vptr_BasePort[0x23])
                          (pBVar1,(ulong)(this->super_BoardIO).BoardId,uVar6,&read_data);
        if (((char)iVar3 != '\0') && (bVar2 = false, (read_data & 0x7000000) == 0)) {
          local_3c = read_data >> 0x10 & 0x1f;
          bVar8 = local_3c == local_40;
          bVar2 = true;
        }
      } while( true );
    }
  }
  else {
    uVar5 = 0;
  }
LAB_00107d86:
  return SUB41(uVar5,0);
LAB_00107cc7:
  if (!bVar8) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "ReadRTL8211F_Register regAddr mismatch, expected ");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,", received ");
LAB_00107d4f:
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  *puVar7 = (uint16_t)read_data;
  uVar5 = (uint)(byte)(bVar2 & bVar8);
  goto LAB_00107d86;
}

Assistant:

bool FpgaIO::ReadRTL8211F_Register(unsigned int chan, unsigned int phyAddr, unsigned int regAddr, uint16_t &data)
{
    // Should have firmware/hardware checks
    // Wait for FPGA mdio interface to be idle
    if (!WaitRTL8211F_Idle("ReadRTL8211F_Register", chan, 20))
        return false;
    nodeaddr_t address = 0x40a0 | (chan << 8);
    // Format: 0110 PPPP PRRR RRXX X(16), where P indicates phyAddr, R indicates regAddr, X is don't care (0)
    uint32_t write_data = 0x60000000 | ((phyAddr&0x1f) << 23) | ((regAddr&0x1f) << 18);
    if (!port->WriteQuadlet(BoardId, address, write_data))
        return false;
    // Read data is not valid unless FPGA mdio interface is in idle state. For most interfaces (e.g., Firewire,
    // Ethernet), this will already be the case, but the Zynq EMIO mmap interface is fast so some waiting is needed.
    // First, wait 1 millisecond
    Amp1394_Sleep(0.001);
    // Now, loop up to 20 times until mdio interface is idle and register address matches
    quadlet_t read_data;
    unsigned int regAddrRead;
    bool isIdle = false;
    bool regAddrMatch = false;
    unsigned int i = 0;
    while (!(isIdle && regAddrMatch) && (i++ < 20)) {
        if (port->ReadQuadlet(BoardId, address, read_data)) {
            isIdle = ((read_data&0x07000000) == 0);
            if (isIdle) {
                regAddrRead = (read_data & 0x001f0000)>>16;
                regAddrMatch = (regAddrRead == regAddr);
            }
        }
    }
    if (!isIdle) {
        std::cout << "ReadRTL8211F_Register timeout waiting for data, read " << std::hex
                  << read_data << std::dec << std::endl;
    }
    else if (!regAddrMatch) {
        std::cout << "ReadRTL8211F_Register regAddr mismatch, expected " << std::hex
                  << regAddr << ", received " << regAddrRead << std::dec << std::endl;
    }
    // Set data even if error, since it could be correct and caller may not check return value
    data = static_cast<uint16_t>(read_data & 0x0000ffff);
    return (isIdle & regAddrMatch);
}